

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_snap_functions.cc
# Opt level: O2

void __thiscall
s2builderutil::IntLatLngSnapFunction::set_snap_radius
          (IntLatLngSnapFunction *this,S1Angle snap_radius)

{
  S1Angle SVar1;
  S2LogMessage local_18;
  
  SVar1 = MinSnapRadiusForExponent(this->exponent_);
  if (snap_radius.radians_ < SVar1.radians_) {
    S2LogMessage::S2LogMessage
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
               ,0xed,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_18.stream_,
                    "Check failed: (snap_radius) >= (MinSnapRadiusForExponent(exponent())) ");
  }
  else {
    if (snap_radius.radians_ <= 1.2217304763960306) {
      (this->snap_radius_).radians_ = snap_radius.radians_;
      return;
    }
    S2LogMessage::S2LogMessage
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
               ,0xee,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_18.stream_,"Check failed: (snap_radius) <= (kMaxSnapRadius()) ");
  }
  abort();
}

Assistant:

void IntLatLngSnapFunction::set_snap_radius(S1Angle snap_radius) {
  S2_DCHECK_GE(snap_radius, MinSnapRadiusForExponent(exponent()));
  S2_DCHECK_LE(snap_radius, kMaxSnapRadius());
  snap_radius_ = snap_radius;
}